

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O2

void EVP_PKEY_free(EVP_PKEY *pkey)

{
  int iVar1;
  
  if (pkey != (EVP_PKEY *)0x0) {
    iVar1 = CRYPTO_refcount_dec_and_test_zero((CRYPTO_refcount_t *)pkey);
    if (iVar1 != 0) {
      free_it((EVP_PKEY *)pkey);
      OPENSSL_free(pkey);
      return;
    }
  }
  return;
}

Assistant:

void EVP_PKEY_free(EVP_PKEY *pkey) {
  if (pkey == NULL) {
    return;
  }

  if (!CRYPTO_refcount_dec_and_test_zero(&pkey->references)) {
    return;
  }

  free_it(pkey);
  OPENSSL_free(pkey);
}